

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          string *param_2)

{
  string *psVar1;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  local_40.View_._M_len = 0x22;
  local_40.View_._M_str = "cmake_object_order_depends_target_";
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_70.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_70.View_._M_len = psVar1->_M_string_length;
  cmStrCat<>(__return_storage_ptr__,&local_40,&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& /*config*/) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName());
}